

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O0

void __thiscall Analysis::UpdateParameterDict(Analysis *this,string *param_filename)

{
  string *in_RSI;
  string *in_stack_00002968;
  ParameterReader *in_stack_00002970;
  ParameterReader *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  ParameterReader::readFromFile(in_stack_00002970,in_stack_00002968);
  std::__cxx11::string::~string(local_30);
  ParameterReader::echo(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void Analysis::UpdateParameterDict(std::string param_filename) {
    paraRdr_.readFromFile(param_filename);
    paraRdr_.echo();
}